

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_script.cpp
# Opt level: O3

Script * cfd::core::ScriptUtil::CreatePegoutLogkingScript
                   (Script *__return_storage_ptr__,BlockHash *genesisblock_hash,
                   Script *parent_locking_script,Pubkey *btc_pubkey_bytes,ByteData *whitelist_proof)

{
  bool bVar1;
  size_t sVar2;
  ScriptBuilder builder;
  ScriptBuilder local_68;
  ByteData local_48;
  
  local_68._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_007219a8;
  local_68.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ScriptBuilder::AppendOperator(&local_68,(ScriptOperator *)ScriptOperator::OP_RETURN);
  BlockHash::GetData(&local_48,genesisblock_hash);
  ScriptBuilder::AppendData(&local_68,&local_48);
  if (local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_48.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_start);
  }
  ScriptBuilder::AppendData(&local_68,parent_locking_script);
  bVar1 = Pubkey::IsValid(btc_pubkey_bytes);
  if (bVar1) {
    sVar2 = ByteData::GetDataSize(whitelist_proof);
    if (sVar2 != 0) {
      ScriptBuilder::AppendData(&local_68,btc_pubkey_bytes);
      ScriptBuilder::AppendData(&local_68,whitelist_proof);
    }
  }
  ScriptBuilder::Build(__return_storage_ptr__,&local_68);
  local_68._vptr_ScriptBuilder = (_func_int **)&PTR__ScriptBuilder_007219a8;
  if (local_68.script_byte_array_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.script_byte_array_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return __return_storage_ptr__;
}

Assistant:

Script ScriptUtil::CreatePegoutLogkingScript(
    const BlockHash& genesisblock_hash, const Script& parent_locking_script,
    const Pubkey& btc_pubkey_bytes, const ByteData& whitelist_proof) {
  // create script
  ScriptBuilder builder;
  builder.AppendOperator(ScriptOperator::OP_RETURN);
  builder.AppendData(genesisblock_hash.GetData());
  builder.AppendData(parent_locking_script);
  if (btc_pubkey_bytes.IsValid() && (whitelist_proof.GetDataSize() > 0)) {
    builder.AppendData(btc_pubkey_bytes);
    builder.AppendData(whitelist_proof);
  }
  Script locking_script = builder.Build();
  return locking_script;
}